

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O3

void * mpack_expect_array_alloc_impl
                 (mpack_reader_t *reader,size_t element_size,uint32_t max_count,uint32_t *out_count,
                 _Bool allow_nil)

{
  uint uVar1;
  uint32_t uVar2;
  undefined8 in_RAX;
  void *pvVar3;
  undefined3 in_register_00000081;
  uint32_t count;
  undefined8 uStack_28;
  
  *out_count = 0;
  uStack_28 = in_RAX;
  if (CONCAT31(in_register_00000081,allow_nil) == 0) {
    uVar2 = mpack_expect_array_range(reader,0,max_count);
    uStack_28 = CONCAT44(uVar2,(undefined4)uStack_28);
  }
  else {
    mpack_expect_array_max_or_nil(reader,max_count,(uint32_t *)((long)&uStack_28 + 4));
  }
  if (reader->error == mpack_ok) {
    uVar1 = uStack_28._4_4_;
    if ((ulong)uStack_28._4_4_ != 0) {
      pvVar3 = malloc(element_size * uStack_28._4_4_);
      if (pvVar3 != (void *)0x0) {
        *out_count = uVar1;
        return pvVar3;
      }
      reader->error = mpack_error_memory;
      reader->end = reader->data;
      if (reader->error_fn != (mpack_reader_error_t)0x0) {
        (*reader->error_fn)(reader,mpack_error_memory);
      }
    }
  }
  return (void *)0x0;
}

Assistant:

void* mpack_expect_array_alloc_impl(mpack_reader_t* reader, size_t element_size, uint32_t max_count, uint32_t* out_count, bool allow_nil) {
    mpack_assert(out_count != NULL, "out_count cannot be NULL");
    *out_count = 0;

    uint32_t count;
    bool has_array = true;
    if (allow_nil)
        has_array = mpack_expect_array_max_or_nil(reader, max_count, &count);
    else
        count = mpack_expect_array_max(reader, max_count);
    if (mpack_reader_error(reader))
        return NULL;

    // size 0 is not an error; we return NULL for no elements.
    if (count == 0) {
        // we call mpack_done_array() automatically ONLY if we are using
        // the _or_nil variant. this is the only way to allow nil and empty
        // to work the same way.
        if (allow_nil && has_array)
            mpack_done_array(reader);
        return NULL;
    }

    void* p = MPACK_MALLOC(element_size * count);
    if (p == NULL) {
        mpack_reader_flag_error(reader, mpack_error_memory);
        return NULL;
    }

    *out_count = count;
    return p;
}